

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::SelectFlatLoopSwitch<float,float,duckdb::GreaterThan,false,false>
                (float *ldata,float *rdata,SelectionVector *sel,idx_t count,ValidityMask *mask,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  bool bVar2;
  idx_t iVar3;
  ulong uVar4;
  float *pfVar5;
  float *pfVar6;
  ulong uVar7;
  sel_t sVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      iVar3 = SelectFlatLoop<float,float,duckdb::GreaterThan,false,false,false,true>
                        (ldata,rdata,sel,count,mask,(SelectionVector *)0x0,false_sel);
      return iVar3;
    }
    if (count + 0x3f < 0x40) {
      iVar3 = 0;
    }
    else {
      iVar3 = 0;
      uVar7 = 0;
      uVar10 = 0;
      do {
        puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar9 = uVar10 + 0x40;
          if (count <= uVar10 + 0x40) {
            uVar9 = count;
          }
LAB_00f05ae7:
          uVar4 = uVar10;
          if (uVar10 < uVar9) {
            pfVar6 = rdata + uVar10;
            pfVar5 = ldata + uVar10;
            do {
              uVar12 = uVar10;
              if (sel->sel_vector != (sel_t *)0x0) {
                uVar12 = (ulong)sel->sel_vector[uVar10];
              }
              bVar2 = GreaterThan::Operation<float>(pfVar5,pfVar6);
              true_sel->sel_vector[iVar3] = (sel_t)uVar12;
              iVar3 = iVar3 + bVar2;
              uVar10 = uVar10 + 1;
              pfVar6 = pfVar6 + 1;
              pfVar5 = pfVar5 + 1;
              uVar4 = uVar9;
            } while (uVar9 != uVar10);
          }
        }
        else {
          uVar12 = puVar1[uVar7];
          uVar9 = uVar10 + 0x40;
          if (count <= uVar10 + 0x40) {
            uVar9 = count;
          }
          uVar4 = uVar9;
          if (uVar12 != 0) {
            if (uVar12 == 0xffffffffffffffff) goto LAB_00f05ae7;
            uVar4 = uVar10;
            if (uVar10 < uVar9) {
              pfVar6 = rdata + uVar10;
              pfVar5 = ldata + uVar10;
              uVar11 = 0;
              do {
                if (sel->sel_vector == (sel_t *)0x0) {
                  sVar8 = (int)uVar10 + (int)uVar11;
                }
                else {
                  sVar8 = sel->sel_vector[uVar10 + uVar11];
                }
                if ((uVar12 >> (uVar11 & 0x3f) & 1) == 0) {
                  uVar4 = 0;
                }
                else {
                  bVar2 = GreaterThan::Operation<float>(pfVar5,pfVar6);
                  uVar4 = (ulong)bVar2;
                }
                true_sel->sel_vector[iVar3] = sVar8;
                iVar3 = iVar3 + uVar4;
                uVar11 = uVar11 + 1;
                pfVar6 = pfVar6 + 1;
                pfVar5 = pfVar5 + 1;
                uVar4 = uVar9;
              } while ((uVar10 - uVar9) + uVar11 != 0);
            }
          }
        }
        uVar7 = uVar7 + 1;
        uVar10 = uVar4;
      } while (uVar7 != count + 0x3f >> 6);
    }
  }
  else {
    iVar3 = SelectFlatLoop<float,float,duckdb::GreaterThan,false,false,true,true>
                      (ldata,rdata,sel,count,mask,true_sel,false_sel);
  }
  return iVar3;
}

Assistant:

static inline idx_t SelectFlatLoopSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                         const SelectionVector *sel, idx_t count, ValidityMask &mask,
	                                         SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else if (true_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, false>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, false, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		}
	}